

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxStackVariable::Emit(FxStackVariable *this,VMFunctionBuilder *build)

{
  byte bVar1;
  byte bVar2;
  uint opc;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  PField *pPVar6;
  ExpEmit EVar7;
  uint uVar8;
  ExpEmit obj;
  
  pPVar6 = this->membervar;
  if (pPVar6->Offset == 0) {
    if (this->AddressRequested != false) {
LAB_005139d1:
      EVar7 = build->FramePointer;
      uVar3 = EVar7._2_4_ & 0xffff;
      uVar8 = EVar7._3_4_ & 0xff;
      uVar5 = (ulong)EVar7 & 0xffffffff00000000;
      goto LAB_00513aea;
    }
    opc = 0xffffffff;
LAB_00513a00:
    bVar1 = pPVar6->Type->RegType;
    uVar3 = (uint)bVar1;
    bVar2 = pPVar6->Type->RegCount;
    uVar8 = (uint)bVar2;
    uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers + bVar1,(uint)bVar2);
    EVar7.Konst = false;
    EVar7.Fixed = false;
    EVar7.Final = false;
    EVar7.Target = false;
    EVar7.RegNum = (short)uVar4;
    EVar7.RegType = (char)(uVar4 >> 0x10);
    EVar7.RegCount = (char)(uVar4 >> 0x18);
    pPVar6 = this->membervar;
    if (pPVar6->BitValue != -1) {
      uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
      obj.RegNum = (uint16_t)uVar3;
      obj.RegType = '\x03';
      obj.RegCount = '\x01';
      obj.Konst = false;
      obj.Fixed = false;
      obj.Final = false;
      obj.Target = false;
      if (-1 < (int)opc) {
        VMFunctionBuilder::Emit(build,0xcd,uVar3 & 0xffff,(uint)(build->FramePointer).RegNum,opc);
      }
      ExpEmit::Free(&obj,build);
      VMFunctionBuilder::Emit
                (build,0x24,uVar4 & 0xffff,uVar3 & 0xffff,
                 1 << ((byte)this->membervar->BitValue & 0x1f));
      uVar5 = 0;
      uVar3 = (uint)bVar1;
      goto LAB_00513aea;
    }
    if (opc == 0xffffffff) {
      opc = VMFunctionBuilder::GetConstantInt(build,0);
      pPVar6 = this->membervar;
    }
    VMFunctionBuilder::Emit
              (build,(uint)pPVar6->Type->loadOp,uVar4 & 0xffff,(uint)(build->FramePointer).RegNum,
               opc);
    uVar8 = (uint)bVar2;
  }
  else {
    opc = VMFunctionBuilder::GetConstantInt(build,(int)pPVar6->Offset);
    if (this->AddressRequested == false) {
      pPVar6 = this->membervar;
      goto LAB_00513a00;
    }
    if ((int)opc < 0) goto LAB_005139d1;
    uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
    EVar7.Konst = false;
    EVar7.Fixed = false;
    EVar7.Final = false;
    EVar7.Target = false;
    EVar7.RegNum = (short)uVar3;
    EVar7.RegType = (char)(uVar3 >> 0x10);
    EVar7.RegCount = (char)(uVar3 >> 0x18);
    VMFunctionBuilder::Emit(build,0xcd,uVar3 & 0xffff,(uint)(build->FramePointer).RegNum,opc);
    uVar3 = 3;
    uVar8 = 1;
  }
  uVar5 = 0;
LAB_00513aea:
  return (ExpEmit)((ulong)EVar7 & 0xffff | (ulong)((uVar3 & 0xff) << 0x10) | uVar8 << 0x18 | uVar5);
}

Assistant:

ExpEmit FxStackVariable::Emit(VMFunctionBuilder *build)
{
	int offsetreg = -1;
	
	if (membervar->Offset != 0) offsetreg = build->GetConstantInt((int)membervar->Offset);

	if (AddressRequested)
	{
		if (offsetreg >= 0)
		{
			ExpEmit obj(build, REGT_POINTER);
			build->Emit(OP_ADDA_RK, obj.RegNum, build->FramePointer.RegNum, offsetreg);
			return obj;
		}
		else
		{
			return build->FramePointer;
		}
	}
	ExpEmit loc(build, membervar->Type->GetRegType(), membervar->Type->GetRegCount());

	if (membervar->BitValue == -1)
	{
		if (offsetreg == -1) offsetreg = build->GetConstantInt(0);
		build->Emit(membervar->Type->GetLoadOp(), loc.RegNum, build->FramePointer.RegNum, offsetreg);
	}
	else
	{
		ExpEmit obj(build, REGT_POINTER);
		if (offsetreg >= 0) build->Emit(OP_ADDA_RK, obj.RegNum, build->FramePointer.RegNum, offsetreg);
		obj.Free(build);
		build->Emit(OP_LBIT, loc.RegNum, obj.RegNum, 1 << membervar->BitValue);
	}
	return loc;
}